

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void discharge2reg(FuncState *fs,expdesc *e,int reg)

{
  int iVar1;
  Instruction *pIVar2;
  uint uVar3;
  OpCode o;
  
  luaK_dischargevars(fs,e);
  switch(e->k) {
  case VNIL:
    luaK_nil(fs,reg,1);
    break;
  case VTRUE:
  case VFALSE:
    uVar3 = (uint)(e->k == VTRUE);
    o = OP_LOADBOOL;
LAB_0010c976:
    luaK_codeABC(fs,o,reg,uVar3,0);
    break;
  case VK:
    uVar3 = (e->u).s.info;
    goto LAB_0010c9e4;
  case VKNUM:
    uVar3 = luaK_numberK(fs,(e->u).nval);
LAB_0010c9e4:
    luaK_codeABx(fs,OP_LOADK,reg,uVar3);
    break;
  default:
    goto switchD_0010c966_caseD_6;
  case VRELOCABLE:
    pIVar2 = fs->f->code;
    iVar1 = (e->u).s.info;
    pIVar2[iVar1] = (reg & 0xffU) << 6 | pIVar2[iVar1] & 0xffffc03f;
    break;
  case VNONRELOC:
    uVar3 = (e->u).s.info;
    if (uVar3 != reg) {
      o = OP_MOVE;
      goto LAB_0010c976;
    }
  }
  (e->u).s.info = reg;
  e->k = VNONRELOC;
switchD_0010c966_caseD_6:
  return;
}

Assistant:

static void discharge2reg(FuncState*fs,expdesc*e,int reg){
luaK_dischargevars(fs,e);
switch(e->k){
case VNIL:{
luaK_nil(fs,reg,1);
break;
}
case VFALSE:case VTRUE:{
luaK_codeABC(fs,OP_LOADBOOL,reg,e->k==VTRUE,0);
break;
}
case VK:{
luaK_codeABx(fs,OP_LOADK,reg,e->u.s.info);
break;
}
case VKNUM:{
luaK_codeABx(fs,OP_LOADK,reg,luaK_numberK(fs,e->u.nval));
break;
}
case VRELOCABLE:{
Instruction*pc=&getcode(fs,e);
SETARG_A(*pc,reg);
break;
}
case VNONRELOC:{
if(reg!=e->u.s.info)
luaK_codeABC(fs,OP_MOVE,reg,e->u.s.info,0);
break;
}
default:{
return;
}
}
e->u.s.info=reg;
e->k=VNONRELOC;
}